

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TaggedPattern * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TaggedPattern,slang::ast::FieldSymbol_const&,slang::ast::Pattern_const*&,slang::SourceRange>
          (BumpAllocator *this,FieldSymbol *args,Pattern **args_1,SourceRange *args_2)

{
  Pattern *pPVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  TaggedPattern *pTVar4;
  
  pTVar4 = (TaggedPattern *)allocate(this,0x30,8);
  pPVar1 = *args_1;
  SVar2 = args_2->startLoc;
  SVar3 = args_2->endLoc;
  (pTVar4->super_Pattern).kind = Tagged;
  (pTVar4->super_Pattern).syntax = (SyntaxNode *)0x0;
  (pTVar4->super_Pattern).sourceRange.startLoc = SVar2;
  (pTVar4->super_Pattern).sourceRange.endLoc = SVar3;
  pTVar4->member = args;
  pTVar4->valuePattern = pPVar1;
  return pTVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }